

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ugen.c
# Opt level: O3

void ugen_done_graph(_dspcontext *dc)

{
  int downsample;
  int upsample;
  int iVar1;
  _dspcontext *p_Var2;
  _vinlet *x;
  _sigoutconnect *p_Var3;
  bool bVar4;
  _instanceugen *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  t_object *ptVar9;
  char *pcVar10;
  _class *p_Var11;
  t_signal *sig2;
  t_signal **parentsigs;
  _ugenbox *p_Var12;
  t_signal *ptVar13;
  t_pd p_Var14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  _siginlet *p_Var18;
  t_ugenbox *ptVar19;
  ulong uVar20;
  t_signal **pptVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  size_t nbytes;
  code *f;
  t_object *object;
  _sigoutlet *p_Var26;
  long lVar27;
  t_sigoutconnect *ptVar28;
  t_float sr;
  t_float tVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  int local_74;
  int local_70;
  int local_60;
  int local_48;
  int local_40;
  
  p_Var2 = dc->dc_parentcontext;
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) == 0) {
LAB_0012efad:
    p_Var12 = dc->dc_ugenlist;
    if (p_Var12 == (_ugenbox *)0x0) goto LAB_0012f001;
    object = (t_object *)0x0;
    p_Var11 = block_class;
    do {
      ptVar9 = object;
      if (((p_Var12->u_obj->te_g).g_pd == p_Var11) &&
         (ptVar9 = p_Var12->u_obj, object != (t_object *)0x0)) {
        pd_error(object,"conflicting block~ and/or switch~ objects in same window");
        p_Var11 = block_class;
        ptVar9 = object;
      }
      object = ptVar9;
      p_Var12 = p_Var12->u_next;
    } while (p_Var12 != (_ugenbox *)0x0);
  }
  else {
    post("ugen_done_graph...");
    p_Var12 = dc->dc_ugenlist;
    if (p_Var12 != (_ugenbox *)0x0) {
      do {
        class_getname((p_Var12->u_obj->te_g).g_pd);
        post("ugen: %s");
        iVar23 = p_Var12->u_nout;
        if (0 < iVar23) {
          p_Var26 = p_Var12->u_out;
          uVar20 = 0;
          do {
            ptVar28 = p_Var26->o_connections;
            if (ptVar28 != (t_sigoutconnect *)0x0) {
              do {
                pcVar10 = class_getname((ptVar28->oc_who->u_obj->te_g).g_pd);
                ptVar19 = dc->dc_ugenlist;
                uVar16 = 0xffffffff;
                if (ptVar19 != (t_ugenbox *)0x0) {
                  uVar24 = 0;
                  do {
                    if (ptVar19 == ptVar28->oc_who) {
                      uVar16 = (ulong)uVar24;
                      break;
                    }
                    uVar24 = uVar24 + 1;
                    ptVar19 = ptVar19->u_next;
                  } while (ptVar19 != (_ugenbox *)0x0);
                }
                post("... out %d to %s, index %d, inlet %d",uVar20,pcVar10,uVar16,
                     (ulong)(uint)ptVar28->oc_inno);
                ptVar28 = ptVar28->oc_next;
              } while (ptVar28 != (_sigoutconnect *)0x0);
              iVar23 = p_Var12->u_nout;
            }
            p_Var26 = p_Var26 + 1;
            uVar24 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar24;
          } while ((int)uVar24 < iVar23);
        }
        p_Var12 = p_Var12->u_next;
      } while (p_Var12 != (_ugenbox *)0x0);
      goto LAB_0012efad;
    }
LAB_0012f001:
    object = (t_object *)0x0;
  }
  if (p_Var2 == (_dspcontext *)0x0) {
    sr = sys_getsr();
    local_60 = sys_getblksize();
    tVar29 = sr;
    local_74 = local_60;
    if (object != (t_object *)0x0) goto LAB_0012f049;
  }
  else {
    sr = p_Var2->dc_srate;
    local_60 = p_Var2->dc_vecsize;
    if (object != (t_object *)0x0) {
LAB_0012f049:
      iVar23 = *(int *)&object[1].te_g.g_pd;
      local_74 = *(int *)((long)&object[1].te_g.g_pd + 4);
      if (iVar23 == 0) {
        iVar23 = local_60;
      }
      if (local_74 == 0) {
        local_74 = iVar23;
      }
      iVar22 = *(int *)&object[1].te_g.g_next;
      if (iVar23 <= iVar22) {
        iVar22 = iVar23;
      }
      downsample = *(int *)&object[2].te_g.g_pd;
      upsample = *(int *)&object[1].te_width;
      if (local_60 <= downsample) {
        downsample = local_60;
      }
      local_48 = local_60 * upsample * iVar22;
      local_40 = (downsample * iVar23) / local_48;
      local_48 = local_48 / (downsample * iVar23);
      if (local_40 < 2) {
        local_40 = 1;
      }
      if (local_48 < 2) {
        local_48 = 1;
      }
      *(int *)((long)&object[1].te_binbuf + 4) = local_48;
      *(int *)&object[1].te_binbuf = local_40;
      *(uint *)((long)&object[1].te_g.g_next + 4) =
           local_40 - 1U & *(uint *)(pd_maininstance.pd_ugen + 0x130);
      if ((((p_Var2 == (_dspcontext *)0x0) || (iVar22 != 1)) || (upsample != 1)) ||
         ((iVar23 != local_60 || (uVar20 = 0, downsample != 1)))) {
        uVar20 = 1;
      }
      tVar29 = ((float)upsample * (float)iVar22 * sr) / (float)downsample;
      uVar16 = (ulong)(uint)(int)(char)object[1].te_xpix;
      bVar4 = false;
      goto LAB_0012f17a;
    }
    tVar29 = sr;
    local_74 = p_Var2->dc_calcsize;
  }
  uVar20 = (ulong)(p_Var2 == (_dspcontext *)0x0);
  uVar16 = 0;
  local_40 = 1;
  bVar4 = true;
  local_48 = 1;
  downsample = 1;
  upsample = 1;
  iVar23 = local_60;
  sr = tVar29;
LAB_0012f17a:
  dc->dc_reblock = (char)uVar20;
  dc->dc_switched = (char)uVar16;
  dc->dc_srate = tVar29;
  dc->dc_vecsize = iVar23;
  dc->dc_calcsize = local_74;
  pptVar21 = dc->dc_iosigs;
  iVar22 = (int)uVar16;
  local_70 = (int)uVar20;
  if (((pptVar21 != (t_signal **)0x0) && (iVar22 != 0 || local_70 != 0)) && (0 < dc->dc_noutlets)) {
    iVar1 = dc->dc_ninlets;
    lVar27 = 0;
    do {
      ptVar13 = pptVar21[iVar1 + lVar27];
      if ((ptVar13->s_isborrowed != 0) && (ptVar13->s_borrowedfrom == (_signal *)0x0)) {
        sig2 = signal_new(local_60,sr);
        signal_setborrowed(ptVar13,sig2);
        ptVar13 = pptVar21[iVar1 + lVar27];
        ptVar13->s_refcount = ptVar13->s_refcount + 1;
        if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
          post("set %lx->%lx",ptVar13,ptVar13->s_borrowedfrom);
        }
      }
      lVar27 = lVar27 + 1;
    } while ((int)lVar27 < dc->dc_noutlets);
  }
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("reblock %d, switched %d",uVar20,uVar16);
  }
  for (p_Var12 = dc->dc_ugenlist; p_Var12 != (_ugenbox *)0x0; p_Var12 = p_Var12->u_next) {
    pptVar21 = dc->dc_iosigs;
    if (pptVar21 == (t_signal **)0x0) {
      parentsigs = (t_signal **)0x0;
    }
    else {
      parentsigs = pptVar21 + dc->dc_ninlets;
    }
    x = (_vinlet *)p_Var12->u_obj;
    p_Var14 = (x->x_obj).te_g.g_pd;
    if (p_Var14 == vinlet_class) {
      vinlet_dspprolog(x,pptVar21,iVar23,local_74,*(int *)(pd_maininstance.pd_ugen + 0x130),local_40
                       ,local_48,downsample,upsample,local_70,iVar22);
    }
    else if (p_Var14 == voutlet_class) {
      voutlet_dspprolog((_voutlet *)x,parentsigs,iVar23,local_74,
                        *(int *)(pd_maininstance.pd_ugen + 0x130),local_40,local_48,downsample,
                        upsample,local_70,iVar22);
    }
  }
  iVar1 = *(int *)(pd_maininstance.pd_ugen + 8);
  if ((!bVar4) && (iVar22 != 0 || local_70 != 0)) {
    dsp_add(block_prolog,1,object);
    *(int *)((long)&object[1].te_outlet + 4) = *(int *)(pd_maininstance.pd_ugen + 8) + -1;
  }
  auVar8 = _DAT_001b53a0;
  auVar7 = _DAT_001b5390;
  auVar6 = _DAT_001b5380;
  p_Var12 = dc->dc_ugenlist;
  if (p_Var12 != (_ugenbox *)0x0) {
    do {
      p_Var12->u_done = 0;
      uVar16 = (ulong)(uint)p_Var12->u_nout;
      if (uVar16 != 0) {
        lVar27 = uVar16 - 1;
        auVar30._8_4_ = (int)lVar27;
        auVar30._0_8_ = lVar27;
        auVar30._12_4_ = (int)((ulong)lVar27 >> 0x20);
        piVar17 = &p_Var12->u_out->o_nsent;
        auVar30 = auVar30 ^ auVar8;
        uVar25 = 0;
        do {
          auVar31._8_4_ = (int)uVar25;
          auVar31._0_8_ = uVar25;
          auVar31._12_4_ = (int)(uVar25 >> 0x20);
          auVar32 = (auVar31 | auVar7) ^ auVar8;
          iVar15 = auVar30._4_4_;
          if ((bool)(~(iVar15 < auVar32._4_4_ ||
                      auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar15) & 1)) {
            *piVar17 = 0;
          }
          if (auVar32._12_4_ <= auVar30._12_4_ &&
              (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
            piVar17[6] = 0;
          }
          auVar31 = (auVar31 | auVar6) ^ auVar8;
          iVar33 = auVar31._4_4_;
          if (iVar33 <= iVar15 && (iVar33 != iVar15 || auVar31._0_4_ <= auVar30._0_4_)) {
            piVar17[0xc] = 0;
            piVar17[0x12] = 0;
          }
          uVar25 = uVar25 + 4;
          piVar17 = piVar17 + 0x18;
        } while ((uVar16 + 3 & 0xfffffffffffffffc) != uVar25);
      }
      iVar15 = p_Var12->u_nin;
      if (iVar15 != 0) {
        pptVar21 = &p_Var12->u_in->i_signal;
        do {
          *(int *)((long)pptVar21 + -4) = 0;
          *pptVar21 = (t_signal *)0x0;
          pptVar21 = pptVar21 + 2;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      p_Var12 = p_Var12->u_next;
    } while (p_Var12 != (_ugenbox *)0x0);
    p_Var12 = dc->dc_ugenlist;
    if (p_Var12 != (_ugenbox *)0x0) {
      do {
        if (p_Var12->u_done == 0) {
          iVar15 = p_Var12->u_nin;
          if (iVar15 != 0) {
            p_Var18 = p_Var12->u_in;
            do {
              if (p_Var18->i_nconnect != 0) goto LAB_0012f4f5;
              p_Var18 = p_Var18 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          ugen_doit(dc,p_Var12);
        }
LAB_0012f4f5:
        p_Var12 = p_Var12->u_next;
      } while (p_Var12 != (_ugenbox *)0x0);
      for (p_Var12 = dc->dc_ugenlist; p_Var12 != (_ugenbox *)0x0; p_Var12 = p_Var12->u_next) {
        if (p_Var12->u_done == 0) {
          pd_error(p_Var12->u_obj,"DSP loop detected (some tilde objects not scheduled)");
          if (0 < dc->dc_noutlets) {
            iVar15 = dc->dc_ninlets;
            pptVar21 = dc->dc_iosigs;
            lVar27 = 0;
            do {
              if ((pptVar21[iVar15 + lVar27]->s_isborrowed != 0) &&
                 (pptVar21[iVar15 + lVar27]->s_borrowedfrom == (_signal *)0x0)) {
                ptVar13 = signal_new(local_60,sr);
                signal_setborrowed(pptVar21[iVar15 + lVar27],ptVar13);
                pptVar21[iVar15 + lVar27]->s_refcount = pptVar21[iVar15 + lVar27]->s_refcount + 1;
                f = zero_perform;
                if ((ptVar13->s_n & 7U) == 0) {
                  f = zero_perf8;
                }
                dsp_add(f,2,ptVar13->s_vec);
                if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
                  post("oops, belatedly set %lx->%lx",pptVar21[iVar15 + lVar27],
                       pptVar21[iVar15 + lVar27]->s_borrowedfrom);
                }
              }
              lVar27 = lVar27 + 1;
            } while ((int)lVar27 < dc->dc_noutlets);
          }
          break;
        }
      }
    }
  }
  if ((!bVar4) && (iVar22 != 0 || local_70 != 0)) {
    dsp_add(block_epilog,1,object);
  }
  iVar15 = *(int *)(pd_maininstance.pd_ugen + 8);
  p_Var14 = voutlet_class;
  p_Var5 = pd_maininstance.pd_ugen;
  for (p_Var12 = dc->dc_ugenlist; pd_maininstance.pd_ugen = p_Var5, p_Var12 != (_ugenbox *)0x0;
      p_Var12 = p_Var12->u_next) {
    if ((((_voutlet *)p_Var12->u_obj)->x_obj).te_g.g_pd == p_Var14) {
      if (dc->dc_iosigs == (t_signal **)0x0) {
        pptVar21 = (t_signal **)0x0;
      }
      else {
        pptVar21 = dc->dc_iosigs + dc->dc_ninlets;
      }
      voutlet_dspepilog((_voutlet *)p_Var12->u_obj,pptVar21,iVar23,local_74,*(int *)(p_Var5 + 0x130)
                        ,local_40,local_48,downsample,upsample,local_70,iVar22);
      p_Var14 = voutlet_class;
    }
    p_Var5 = pd_maininstance.pd_ugen;
  }
  if (!bVar4) {
    iVar23 = *(int *)(p_Var5 + 8);
    *(int *)&object[1].te_inlet = iVar15 - iVar1;
    *(int *)((long)&object[1].te_inlet + 4) = iVar23 - iVar15;
    *(char *)&object[1].te_ypix = (char)uVar20;
  }
  if (*(int *)(p_Var5 + 0x134) != 0) {
    if ((dc->dc_parentcontext == (_dspcontext *)0x0) && (iVar23 = *(int *)(p_Var5 + 8), iVar23 != 0)
       ) {
      iVar22 = 0;
      do {
        post("chain %lx");
        iVar22 = iVar22 + 1;
      } while (iVar23 != iVar22);
    }
    post("... ugen_done_graph done.");
  }
  while (p_Var12 = dc->dc_ugenlist, p_Var12 != (_ugenbox *)0x0) {
    p_Var26 = p_Var12->u_out;
    iVar23 = p_Var12->u_nout;
    if (iVar23 == 0) {
      nbytes = 0;
    }
    else {
      do {
        ptVar28 = p_Var26->o_connections;
        while (ptVar28 != (t_sigoutconnect *)0x0) {
          p_Var3 = ptVar28->oc_next;
          freebytes(ptVar28,0x18);
          ptVar28 = p_Var3;
        }
        iVar23 = iVar23 + -1;
        p_Var26 = p_Var26 + 1;
      } while (iVar23 != 0);
      p_Var26 = dc->dc_ugenlist->u_out;
      nbytes = (long)dc->dc_ugenlist->u_nout * 0x18;
    }
    freebytes(p_Var26,nbytes);
    freebytes(dc->dc_ugenlist->u_in,(long)dc->dc_ugenlist->u_nin << 4);
    p_Var12 = dc->dc_ugenlist;
    dc->dc_ugenlist = p_Var12->u_next;
    freebytes(p_Var12,0x38);
  }
  if (*(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) == dc) {
    *(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) = dc->dc_parentcontext;
  }
  else {
    bug("THIS->u_context");
  }
  freebytes(dc,0x30);
  return;
}

Assistant:

void ugen_done_graph(t_dspcontext *dc)
{
    t_ugenbox *u;
    t_sigoutlet *uout;
    t_siginlet *uin;
    t_sigoutconnect *oc, *oc2;
    int i, n;
    t_block *blk;
    t_dspcontext *parent_context = dc->dc_parentcontext;
    t_float parent_srate;
    int parent_vecsize;
    int period, frequency, phase, vecsize, calcsize;
    t_float srate;
    int chainblockbegin;    /* DSP chain onset before block prolog code */
    int chainblockend;      /* and after block epilog code */
    int chainafterall;      /* and after signal outlet epilog */
    int reblock = 0, switched;
    int downsample = 1, upsample = 1;
    /* debugging printout */

    if (THIS->u_loud)
    {
        post("ugen_done_graph...");
        for (u = dc->dc_ugenlist; u; u = u->u_next)
        {
            post("ugen: %s", class_getname(u->u_obj->ob_pd));
            for (uout = u->u_out, i = 0; i < u->u_nout; uout++, i++)
                for (oc = uout->o_connections; oc; oc = oc->oc_next)
            {
                post("... out %d to %s, index %d, inlet %d", i,
                    class_getname(oc->oc_who->u_obj->ob_pd),
                        ugen_index(dc, oc->oc_who), oc->oc_inno);
            }
        }
    }

        /* search for an object of class "block~" */
    for (u = dc->dc_ugenlist, blk = 0; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == block_class)
        {
            if (blk)
                pd_error(blk, "conflicting block~ and/or switch~ objects in same window");
            else blk = (t_block *)zz;
        }
    }

        /* figure out block size, calling frequency, sample rate */
    if (parent_context)
    {
        parent_srate = parent_context->dc_srate;
        parent_vecsize = parent_context->dc_vecsize;
    }
    else
    {
        parent_srate = sys_getsr();
        parent_vecsize = sys_getblksize();
    }
    if (blk)
    {
        int realoverlap;
        vecsize = blk->x_vecsize;
        if (vecsize == 0)
            vecsize = parent_vecsize;
        calcsize = blk->x_calcsize;
        if (calcsize == 0)
            calcsize = vecsize;
        realoverlap = blk->x_overlap;
        if (realoverlap > vecsize) realoverlap = vecsize;
        downsample = blk->x_downsample;
        upsample   = blk->x_upsample;
        if (downsample > parent_vecsize)
            downsample = parent_vecsize;
        period = (vecsize * downsample)/
            (parent_vecsize * realoverlap * upsample);
        frequency = (parent_vecsize * realoverlap * upsample)/
            (vecsize * downsample);
        phase = blk->x_phase;
        srate = parent_srate * realoverlap * upsample / downsample;
        if (period < 1) period = 1;
        if (frequency < 1) frequency = 1;
        blk->x_frequency = frequency;
        blk->x_period = period;
        blk->x_phase = THIS->u_phase & (period - 1);
        if (! parent_context || (realoverlap != 1) ||
            (vecsize != parent_vecsize) ||
                (downsample != 1) || (upsample != 1))
                    reblock = 1;
        switched = blk->x_switched;
    }
    else
    {
        srate = parent_srate;
        vecsize = parent_vecsize;
        calcsize = (parent_context ? parent_context->dc_calcsize : vecsize);
        downsample = upsample = 1;
        period = frequency = 1;
        phase = 0;
        if (!parent_context) reblock = 1;
        switched = 0;
    }
    dc->dc_reblock = reblock;
    dc->dc_switched = switched;
    dc->dc_srate = srate;
    dc->dc_vecsize = vecsize;
    dc->dc_calcsize = calcsize;

        /* if we're reblocking or switched, we now have to create output
        signals to fill in for the "borrowed" ones we have now.  This
        is also possibly true even if we're not blocked/switched, in
        the case that there was a signal loop.  But we don't know this
        yet.  */

    if (dc->dc_iosigs && (switched || reblock))
    {
        t_signal **sigp;
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                signal_setborrowed(*sigp,
                    signal_new(parent_vecsize, parent_srate));
                (*sigp)->s_refcount++;

                if (THIS->u_loud) post("set %lx->%lx", *sigp,
                    (*sigp)->s_borrowedfrom);
            }
        }
    }

    if (THIS->u_loud)
        post("reblock %d, switched %d", reblock, switched);

        /* schedule prologs for inlets and outlets.  If the "reblock" flag
        is set, an inlet will put code on the DSP chain to copy its input
        into an internal buffer here, before any unit generators' DSP code
        gets scheduled.  If we don't "reblock", inlets will need to get
        pointers to their corresponding inlets/outlets on the box we're inside,
        if any.  Outlets will also need pointers, unless we're switched, in
        which case outlet epilog code will kick in. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        t_signal **outsigs = dc->dc_iosigs;
        if (outsigs) outsigs += dc->dc_ninlets;

        if (pd_class(zz) == vinlet_class)
            vinlet_dspprolog((struct _vinlet *)zz,
                dc->dc_iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        else if (pd_class(zz) == voutlet_class)
            voutlet_dspprolog((struct _voutlet *)zz,
                outsigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
    }
    chainblockbegin = THIS->u_dspchainsize;

    if (blk && (reblock || switched))   /* add the block DSP prolog */
    {
        dsp_add(block_prolog, 1, blk);
        blk->x_chainonset = THIS->u_dspchainsize - 1;
    }
        /* Initialize for sorting */
    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        u->u_done = 0;
        for (uout = u->u_out, i = u->u_nout; i--; uout++)
            uout->o_nsent = 0;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            uin->i_ngot = 0, uin->i_signal = 0;
   }

        /* Do the sort */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
            /* check that we have no connected signal inlets */
        if (u->u_done) continue;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            if (uin->i_nconnect) goto next;

        ugen_doit(dc, u);
    next: ;
    }

        /* check for a DSP loop, which is evidenced here by the presence
        of ugens not yet scheduled. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
        if (!u->u_done)
    {
        t_signal **sigp;
        pd_error(u->u_obj,
            "DSP loop detected (some tilde objects not scheduled)");
                /* this might imply that we have unfilled "borrowed" outputs
                which we'd better fill in now. */
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                t_signal *s3 = signal_new(parent_vecsize, parent_srate);
                signal_setborrowed(*sigp, s3);
                (*sigp)->s_refcount++;
                dsp_add_zero(s3->s_vec, s3->s_n);
                if (THIS->u_loud)
                    post("oops, belatedly set %lx->%lx", *sigp,
                        (*sigp)->s_borrowedfrom);
            }
        }
        break;   /* don't need to keep looking. */
    }

    if (blk && (reblock || switched))    /* add block DSP epilog */
        dsp_add(block_epilog, 1, blk);
    chainblockend = THIS->u_dspchainsize;

        /* add epilogs for outlets.  */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == voutlet_class)
        {
            t_signal **iosigs = dc->dc_iosigs;
            if (iosigs) iosigs += dc->dc_ninlets;
            voutlet_dspepilog((struct _voutlet *)zz,
                iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        }
    }

    chainafterall = THIS->u_dspchainsize;
    if (blk)
    {
        blk->x_blocklength = chainblockend - chainblockbegin;
        blk->x_epiloglength = chainafterall - chainblockend;
        blk->x_reblock = reblock;
    }

    if (THIS->u_loud)
    {
        t_int *ip;
        if (!dc->dc_parentcontext)
            for (i = THIS->u_dspchainsize, ip = THIS->u_dspchain;
                i--; ip++)
                    post("chain %lx", *ip);
        post("... ugen_done_graph done.");
    }
        /* now delete everything. */
    while (dc->dc_ugenlist)
    {
        for (uout = dc->dc_ugenlist->u_out, n = dc->dc_ugenlist->u_nout;
            n--; uout++)
        {
            oc = uout->o_connections;
            while (oc)
            {
                oc2 = oc->oc_next;
                freebytes(oc, sizeof *oc);
                oc = oc2;
            }
        }
        freebytes(dc->dc_ugenlist->u_out, dc->dc_ugenlist->u_nout *
            sizeof (*dc->dc_ugenlist->u_out));
        freebytes(dc->dc_ugenlist->u_in, dc->dc_ugenlist->u_nin *
            sizeof(*dc->dc_ugenlist->u_in));
        u = dc->dc_ugenlist;
        dc->dc_ugenlist = u->u_next;
        freebytes(u, sizeof *u);
    }
    if (THIS->u_context == dc)
        THIS->u_context = dc->dc_parentcontext;
    else bug("THIS->u_context");
    freebytes(dc, sizeof(*dc));

}